

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_object_get___proto__(JSContext *ctx,JSValue this_val)

{
  int iVar1;
  JSRefCountHeader *p;
  JSValue obj;
  JSValue JVar2;
  
  obj = JS_ToObject(ctx,this_val);
  JVar2 = obj;
  if ((((uint)obj.tag != 6) && (JVar2 = JS_GetPrototype(ctx,obj), 0xfffffff4 < (uint)obj.tag)) &&
     (iVar1 = *obj.u.ptr, *(int *)obj.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,obj);
  }
  return JVar2;
}

Assistant:

static JSValue js_object_get___proto__(JSContext *ctx, JSValueConst this_val)
{
    JSValue val, ret;

    val = JS_ToObject(ctx, this_val);
    if (JS_IsException(val))
        return val;
    ret = JS_GetPrototype(ctx, val);
    JS_FreeValue(ctx, val);
    return ret;
}